

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

optional<helics::MessageProcessingResult> __thiscall
helics::FederateState::checkProcResult
          (FederateState *this,
          tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *proc_result,
          ActionMessage *cmd)

{
  __tuple_element_t<1UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> _Var1;
  format_args args;
  format_args args_00;
  FederateStates FVar2;
  bool bVar3;
  int iVar4;
  GlobalFederateId GVar5;
  action_t aVar6;
  __tuple_element_t<2UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *p_Var7;
  __tuple_element_t<0UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *p_Var8;
  __tuple_element_t<1UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *p_Var9;
  pointer pTVar10;
  ActionMessage *in_RDX;
  FederateState *in_RDI;
  __sv_type _Var11;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  FederateState *in_stack_fffffffffffffd10;
  GlobalFederateId *this_00;
  ActionMessage *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd3c;
  double local_2c0;
  FederateState *in_stack_fffffffffffffd48;
  char *pcVar12;
  undefined8 in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  __sv_type local_288;
  __sv_type local_278;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_268;
  char *local_260;
  undefined8 local_258;
  __sv_type local_230;
  __sv_type local_220;
  baseType local_210;
  baseType local_208;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined1 in_stack_fffffffffffffea0 [16];
  undefined1 auVar13 [13];
  string_view in_stack_fffffffffffffeb0;
  __sv_type in_stack_fffffffffffffec0;
  _Optional_payload_base<helics::MessageProcessingResult> local_ea;
  double local_e8 [2];
  undefined8 local_d8;
  double *local_d0;
  char *local_c8;
  undefined8 uStack_c0;
  double *local_b8;
  char *local_b0;
  undefined8 uStack_a8;
  unsigned_long_long in_stack_ffffffffffffff60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  undefined8 uVar14;
  ActionMessage *in_stack_ffffffffffffffc8;
  FederateState *in_stack_ffffffffffffffd0;
  
  auVar13 = in_stack_fffffffffffffea0._3_13_;
  GVar5.gid = (BaseType)((ulong)in_stack_fffffffffffffd50 >> 0x20);
  p_Var7 = std::get<2ul,helics::FederateStates,helics::MessageProcessingResult,bool>
                     ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
                      0x590989);
  in_RDI->timeGranted_mode = (bool)(*p_Var7 & 1);
  FVar2 = getState((FederateState *)0x59099d);
  iVar4 = CONCAT13((char)((uint)in_stack_fffffffffffffd3c >> 0x18),
                   CONCAT12(FVar2,(short)in_stack_fffffffffffffd3c));
  p_Var8 = std::get<0ul,helics::FederateStates,helics::MessageProcessingResult,bool>
                     ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
                      0x5909ae);
  if ((__tuple_element_t<0UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_>)
      ((uint)iVar4 >> 0x10) != *p_Var8) {
    std::get<0ul,helics::FederateStates,helics::MessageProcessingResult,bool>
              ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)0x5909ca);
    setState(in_stack_fffffffffffffd10,(FederateStates)((ulong)in_stack_fffffffffffffd08 >> 0x38));
    p_Var8 = std::get<0ul,helics::FederateStates,helics::MessageProcessingResult,bool>
                       ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
                        0x5909e4);
    in_stack_fffffffffffffd28 = (ActionMessage *)(ulong)(byte)(*p_Var8 - INITIALIZING);
    switch(in_stack_fffffffffffffd28) {
    case (ActionMessage *)0x0:
      if (0xe < in_RDI->maxLogLevel) {
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd10,
                   in_stack_fffffffffffffd08);
        in_stack_fffffffffffffcf8 = 0;
        logMessage(auVar13._5_8_,auVar13._1_4_,(string_view)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb0,auVar13[0]);
      }
      FVar2 = (FederateStates)((ulong)in_stack_fffffffffffffd08 >> 0x38);
      iVar4 = checkInterfaces((FederateState *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      if (iVar4 != 0) {
        setState(in_stack_fffffffffffffd10,FVar2);
        std::optional<helics::MessageProcessingResult>::
        optional<helics::MessageProcessingResult,_true>
                  ((optional<helics::MessageProcessingResult> *)in_stack_fffffffffffffd00,
                   (MessageProcessingResult *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        return (optional<helics::MessageProcessingResult>)local_ea;
      }
      std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
      operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                  *)0x590ad5);
      TimeCoordinator::enterInitialization
                ((TimeCoordinator *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      break;
    case (ActionMessage *)0x1:
      pTVar10 = std::
                unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
                operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                            *)0x590af0);
      (*(pTVar10->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[2])();
      if (0xe < in_RDI->maxLogLevel) {
        in_stack_fffffffffffffec0 =
             std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd10,
                   in_stack_fffffffffffffd08);
        in_stack_fffffffffffffcf8 = 0;
        logMessage(auVar13._5_8_,auVar13._1_4_,(string_view)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb0,auVar13[0]);
      }
      break;
    default:
      break;
    case (ActionMessage *)0x3:
      bVar3 = SmallBuffer::empty(&in_RDX->payload);
      if (bVar3) {
        commandErrorString((int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffd00,
                  (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        bVar3 = std::operator==(in_stack_fffffffffffffd00,
                                (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8
                                                ));
        if (bVar3) {
          CLI::std::__cxx11::to_string(iVar4);
          std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffffd00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          std::__cxx11::string::~string(in_stack_fffffffffffffd00);
          std::__cxx11::string::~string(in_stack_fffffffffffffd00);
        }
      }
      else {
        SmallBuffer::to_string((SmallBuffer *)0x590d1f);
        std::__cxx11::string::operator=
                  (in_stack_fffffffffffffd00,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      }
      in_RDI->errorCode = in_RDX->messageID;
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
      in_stack_fffffffffffffcf8 = 0;
      logMessage(auVar13._5_8_,auVar13._1_4_,(string_view)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb0,auVar13[0]);
      break;
    case (ActionMessage *)0x4:
      if (0xe < in_RDI->maxLogLevel) {
        _Var11 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00)
        ;
        auVar13 = _Var11._3_13_;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd10,
                   in_stack_fffffffffffffd08);
        in_stack_fffffffffffffcf8 = 0;
        logMessage(auVar13._5_8_,auVar13._1_4_,(string_view)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb0,auVar13[0]);
      }
    }
  }
  p_Var9 = std::get<1ul,helics::FederateStates,helics::MessageProcessingResult,bool>
                     ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
                      0x590de1);
  _Var1 = *p_Var9;
  if (_Var1 == CONTINUE_PROCESSING) {
    std::optional<helics::MessageProcessingResult>::optional
              ((optional<helics::MessageProcessingResult> *)&local_ea);
  }
  else if (_Var1 == DELAY_MESSAGE) {
    addFederateToDelay(in_stack_fffffffffffffd48,GVar5);
    std::optional<helics::MessageProcessingResult>::optional<helics::MessageProcessingResult,_true>
              ((optional<helics::MessageProcessingResult> *)in_stack_fffffffffffffd00,
               (MessageProcessingResult *)
               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  }
  else if (_Var1 == REPROCESS_MESSAGE) {
    this_00 = &in_RDX->dest_id;
    GVar5 = std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
    bVar3 = GlobalFederateId::operator!=(this_00,GVar5);
    if (bVar3) {
      routeMessage(in_RDI,in_stack_fffffffffffffd28);
      std::optional<helics::MessageProcessingResult>::
      optional<helics::MessageProcessingResult,_true>
                ((optional<helics::MessageProcessingResult> *)in_stack_fffffffffffffd00,
                 (MessageProcessingResult *)
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    }
    else {
      processActionMessage(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      std::optional<helics::MessageProcessingResult>::
      optional<helics::MessageProcessingResult,_true>
                ((optional<helics::MessageProcessingResult> *)in_stack_fffffffffffffd00,
                 (MessageProcessingResult *)
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    }
  }
  else {
    if ((in_RDI->timeGranted_mode & 1U) != 0) {
      pTVar10 = std::
                unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
                operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                            *)0x590f1b);
      local_208 = (baseType)TimeCoordinator::getGrantedTime(pTVar10);
      (in_RDI->time_granted).internalTimeCode = local_208;
      std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
      operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                  *)0x590f48);
      local_210 = (baseType)
                  TimeCoordinator::allowedSendTime
                            ((TimeCoordinator *)
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (in_RDI->allowed_send_time).internalTimeCode = local_210;
      aVar6 = ActionMessage::action(in_RDX);
      if (aVar6 == cmd_force_time_grant) {
        if ((in_RDI->ignore_time_mismatch_warnings & 1U) == 0) {
          local_220 = std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffffd00);
          local_260 = "forced Granted Time={}";
          local_258 = 0x16;
          local_268 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                      TimeRepresentation::operator_cast_to_double
                                ((TimeRepresentation<count_time<9,_long>_> *)0x590fe1);
          uVar14 = 10;
          args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                         (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                         local_268.values_;
          args.desc_ = in_stack_ffffffffffffff60;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_ffffffffffffff70,args);
          local_230 = std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffffd00);
          in_stack_fffffffffffffcf8 = 0;
          logMessage(auVar13._5_8_,auVar13._1_4_,(string_view)in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb0,auVar13[0]);
          std::__cxx11::string::~string(in_stack_fffffffffffffd00);
        }
      }
      else if (0xe < in_RDI->maxLogLevel) {
        local_278 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffd00);
        pcVar12 = "Granted Time={}";
        uVar14 = 0xf;
        local_2c0 = TimeRepresentation::operator_cast_to_double
                              ((TimeRepresentation<count_time<9,_long>_> *)0x5911b5);
        in_stack_fffffffffffffd00 = &local_2a8;
        local_b8 = &local_2c0;
        local_d0 = local_e8;
        local_d8 = 10;
        args_00.field_1.args_ = in_stack_ffffffffffffff68.args_;
        args_00.desc_ = (unsigned_long_long)in_stack_fffffffffffffd00;
        local_c8 = pcVar12;
        uStack_c0 = uVar14;
        local_b0 = pcVar12;
        uStack_a8 = uVar14;
        local_e8[0] = local_2c0;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_ffffffffffffff70,args_00);
        local_288 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffd00);
        in_stack_fffffffffffffcf8 = 0;
        logMessage(auVar13._5_8_,auVar13._1_4_,(string_view)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb0,auVar13[0]);
        std::__cxx11::string::~string(in_stack_fffffffffffffd00);
      }
    }
    std::get<1ul,helics::FederateStates,helics::MessageProcessingResult,bool>
              ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)0x591329);
    std::optional<helics::MessageProcessingResult>::
    optional<helics::MessageProcessingResult_&,_true>
              ((optional<helics::MessageProcessingResult> *)in_stack_fffffffffffffd00,
               (MessageProcessingResult *)
               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  }
  return (_Optional_base<helics::MessageProcessingResult,_true,_true>)
         (_Optional_base<helics::MessageProcessingResult,_true,_true>)local_ea;
}

Assistant:

std::optional<MessageProcessingResult> FederateState::checkProcResult(
    std::tuple<FederateStates, MessageProcessingResult, bool>& proc_result,
    ActionMessage& cmd)
{
    timeGranted_mode = std::get<2>(proc_result);

    if (getState() != std::get<0>(proc_result)) {
        setState(std::get<0>(proc_result));
        switch (std::get<0>(proc_result)) {
            case FederateStates::INITIALIZING:
                LOG_TIMING("Granting Initialization");
                if (checkInterfaces() != defs::Errors::OK) {
                    setState(FederateStates::ERRORED);
                    return MessageProcessingResult::ERROR_RESULT;
                }
                timeCoord->enterInitialization();
                break;
            case FederateStates::EXECUTING:
                timeCoord->updateTimeFactors();
                LOG_TIMING("Granting Execution");
                break;
            case FederateStates::FINISHED:
                LOG_TIMING("Terminating");
                break;
            case FederateStates::ERRORED:
                if (cmd.payload.empty()) {
                    errorString = commandErrorString(cmd.messageID);
                    if (errorString == "unknown") {
                        errorString += " code:" + std::to_string(cmd.messageID);
                    }
                } else {
                    errorString = cmd.payload.to_string();
                }
                errorCode = cmd.messageID;
                LOG_ERROR(errorString);
                break;
            default:
                break;
        }
    }

    switch (std::get<1>(proc_result)) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            break;
        case MessageProcessingResult::REPROCESS_MESSAGE:
            if (cmd.dest_id != global_id.load()) {
                routeMessage(cmd);
                return MessageProcessingResult::CONTINUE_PROCESSING;
            }
            return processActionMessage(cmd);
        case MessageProcessingResult::DELAY_MESSAGE:
            addFederateToDelay(GlobalFederateId(cmd.source_id));
            return MessageProcessingResult::DELAY_MESSAGE;
        default:
            if (timeGranted_mode) {
                time_granted = timeCoord->getGrantedTime();
                allowed_send_time = timeCoord->allowedSendTime();
                if (cmd.action() == CMD_FORCE_TIME_GRANT) {
                    if (!ignore_time_mismatch_warnings) {
                        LOG_WARNING(fmt::format("forced Granted Time={}",
                                                static_cast<double>(time_granted)));
                    }
                } else {
                    LOG_TIMING(fmt::format("Granted Time={}", static_cast<double>(time_granted)));
                }
            }
            return (std::get<1>(proc_result));
    }
    return std::nullopt;
}